

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O3

void __thiscall diff_match_patch_test::testMatchAlphabet(diff_match_patch_test *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  wstring *pwVar4;
  wstring local_c8;
  _Rb_tree<wchar_t,_std::pair<const_wchar_t,_int>,_std::_Select1st<std::pair<const_wchar_t,_int>_>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
  local_a8;
  long *local_78 [2];
  long local_68 [2];
  _Rb_tree<wchar_t,_std::pair<const_wchar_t,_int>,_std::_Select1st<std::pair<const_wchar_t,_int>_>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
  local_58;
  
  p_Var1 = &local_58._M_impl.super__Rb_tree_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_impl._0_4_ = 0x61;
  local_c8._M_dataplus._M_p._0_4_ = 4;
  local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::
  _Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
  ::_M_emplace_unique<wchar_t,int>
            ((_Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
              *)&local_58,(wchar_t *)&local_a8,(int *)&local_c8);
  local_a8._M_impl._0_4_ = 0x62;
  local_c8._M_dataplus._M_p._0_4_ = 2;
  std::
  _Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
  ::_M_emplace_unique<wchar_t,int>
            ((_Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
              *)&local_58,(wchar_t *)&local_a8,(int *)&local_c8);
  local_a8._M_impl._0_4_ = 99;
  local_c8._M_dataplus._M_p._0_4_ = 1;
  std::
  _Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
  ::_M_emplace_unique<wchar_t,int>
            ((_Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
              *)&local_58,(wchar_t *)&local_a8,(int *)&local_c8);
  paVar2 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_c8,L"match_alphabet: Unique.",L"");
  local_78[0] = local_68;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_78,L"abc",L"");
  pwVar4 = (wstring *)&local_a8;
  diff_match_patch::match_alphabet(pwVar4);
  assertEquals((diff_match_patch_test *)pwVar4,&local_c8,
               (map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
                *)&local_58,
               (map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
                *)&local_a8);
  std::
  _Rb_tree<wchar_t,_std::pair<const_wchar_t,_int>,_std::_Select1st<std::pair<const_wchar_t,_int>_>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
  ::~_Rb_tree(&local_a8);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity * 4 + 4);
  }
  p_Var3 = &local_a8._M_impl.super__Rb_tree_header;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_impl._0_8_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  std::
  _Rb_tree<wchar_t,_std::pair<const_wchar_t,_int>,_std::_Select1st<std::pair<const_wchar_t,_int>_>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
  ::clear(&local_58);
  if (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    local_58._M_impl.super__Rb_tree_header._M_header._M_color =
         local_a8._M_impl.super__Rb_tree_header._M_header._M_color;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_a8._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_58._M_impl.super__Rb_tree_header._M_header._M_left =
         local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a8._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    local_58._M_impl.super__Rb_tree_header._M_node_count =
         local_a8._M_impl.super__Rb_tree_header._M_node_count;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  }
  std::
  _Rb_tree<wchar_t,_std::pair<const_wchar_t,_int>,_std::_Select1st<std::pair<const_wchar_t,_int>_>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
  ::~_Rb_tree(&local_a8);
  local_a8._M_impl._0_4_ = 0x61;
  local_c8._M_dataplus._M_p._0_4_ = 0x25;
  std::
  _Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
  ::_M_emplace_unique<wchar_t,int>
            ((_Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
              *)&local_58,(wchar_t *)&local_a8,(int *)&local_c8);
  local_a8._M_impl._0_4_ = 0x62;
  local_c8._M_dataplus._M_p._0_4_ = 0x12;
  std::
  _Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
  ::_M_emplace_unique<wchar_t,int>
            ((_Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
              *)&local_58,(wchar_t *)&local_a8,(int *)&local_c8);
  local_a8._M_impl._0_4_ = 99;
  local_c8._M_dataplus._M_p._0_4_ = 8;
  std::
  _Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
  ::_M_emplace_unique<wchar_t,int>
            ((_Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
              *)&local_58,(wchar_t *)&local_a8,(int *)&local_c8);
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_c8,L"match_alphabet: Duplicates.",L"");
  local_78[0] = local_68;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_78,L"abcaba",L"");
  pwVar4 = (wstring *)&local_a8;
  diff_match_patch::match_alphabet(pwVar4);
  assertEquals((diff_match_patch_test *)pwVar4,&local_c8,
               (map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
                *)&local_58,
               (map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
                *)&local_a8);
  std::
  _Rb_tree<wchar_t,_std::pair<const_wchar_t,_int>,_std::_Select1st<std::pair<const_wchar_t,_int>_>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
  ::~_Rb_tree(&local_a8);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity * 4 + 4);
  }
  std::
  _Rb_tree<wchar_t,_std::pair<const_wchar_t,_int>,_std::_Select1st<std::pair<const_wchar_t,_int>_>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
  ::~_Rb_tree(&local_58);
  return;
}

Assistant:

void diff_match_patch_test::testMatchAlphabet() {
  // Initialise the bitmasks for Bitap.
  std::map<wchar_t, int> bitmask;
  bitmask.emplace(L'a', 4);
  bitmask.emplace(L'b', 2);
  bitmask.emplace(L'c', 1);
  assertEquals(L"match_alphabet: Unique.", bitmask, dmp.match_alphabet(L"abc"));

  bitmask = std::map<wchar_t, int>();
  bitmask.emplace(L'a', 37);
  bitmask.emplace(L'b', 18);
  bitmask.emplace(L'c', 8);
  assertEquals(L"match_alphabet: Duplicates.", bitmask, dmp.match_alphabet(L"abcaba"));
}